

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.h
# Opt level: O3

char * leveldb::GetLengthPrefixedSlice(char *p,char *limit,Slice *result)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  
  if (p < limit) {
    uVar5 = (uint)(byte)*p;
    pbVar4 = (byte *)(p + 1);
    if (*p < '\0') {
      uVar6 = 0;
      uVar3 = 0;
      do {
        if (0x15 < uVar3) {
          return (char *)0x0;
        }
        if (limit <= pbVar4) {
          return (char *)0x0;
        }
        uVar1 = uVar3 + 7;
        uVar6 = uVar6 | (uVar5 & 0x7f) << ((byte)uVar3 & 0x1f);
        bVar2 = *pbVar4;
        uVar5 = (uint)bVar2;
        pbVar4 = pbVar4 + 1;
        uVar3 = uVar1;
      } while ((char)bVar2 < '\0');
      uVar5 = uVar5 << ((byte)uVar1 & 0x1f) | uVar6;
    }
    if (pbVar4 + uVar5 <= limit) {
      result->data_ = (char *)pbVar4;
      result->size_ = (ulong)uVar5;
      return (char *)(pbVar4 + uVar5);
    }
  }
  return (char *)0x0;
}

Assistant:

inline const char* GetVarint32Ptr(const char* p, const char* limit,
                                  uint32_t* value) {
  if (p < limit) {
    uint32_t result = *(reinterpret_cast<const uint8_t*>(p));
    if ((result & 128) == 0) {
      *value = result;
      return p + 1;
    }
  }
  return GetVarint32PtrFallback(p, limit, value);
}